

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_smdb.c
# Opt level: O2

uintptr_t mpt_hash_smdb(void *data,int len)

{
  uintptr_t uVar1;
  long lVar2;
  char *str;
  
  if (data == (void *)0x0) {
    uVar1 = 0;
  }
  else if (len < 0) {
    uVar1 = 0;
    for (; (long)*data != 0; data = (void *)((long)data + 1)) {
      uVar1 = uVar1 * 0x1003f + (long)*data;
    }
  }
  else {
    uVar1 = 0;
    for (lVar2 = 0; len != (int)lVar2; lVar2 = lVar2 + 1) {
      uVar1 = (long)*(char *)((long)data + lVar2) + uVar1 * 0x1003f;
    }
  }
  return uVar1;
}

Assistant:

extern uintptr_t mpt_hash_smdb(const void *data, int len)
{
	const char *str;
	uintptr_t hash = 0;
	
	if (!(str = data)) {
		return 0;
	}
	if (len < 0) {
		while (*str) {
			hash = (hash * 65599) + *str++;
		}
		return hash;
	}
	while (len--) {
		hash = (hash * 65599) + *str++;
	}
	return hash;
}